

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void free_parser_working_data(Parser *p)

{
  Reduction *pRVar1;
  SNode *pSVar2;
  Shift *pSVar3;
  PNode *pPVar4;
  uint32 uVar5;
  SNode *sn;
  ZNode *zn;
  PNode *pn;
  Shift *s_1;
  Reduction *r_1;
  Shift *s;
  Reduction *r;
  uint i;
  Parser *p_local;
  
  free_old_nodes(p);
  free_old_nodes(p);
  if ((p->pnode_hash).v != (PNode **)0x0) {
    free((p->pnode_hash).v);
  }
  if ((p->snode_hash).v != (SNode **)0x0) {
    free((p->snode_hash).v);
  }
  memset(&p->pnode_hash,0,0x20);
  memset(&p->snode_hash,0,0x28);
  while (p->reductions_todo != (Reduction *)0x0) {
    pRVar1 = p->free_reductions->next;
    pSVar2 = p->reductions_todo->snode;
    uVar5 = pSVar2->refcount - 1;
    pSVar2->refcount = uVar5;
    if (uVar5 == 0) {
      free_SNode(p,p->reductions_todo->snode);
    }
    free(p->free_reductions);
    p->free_reductions = pRVar1;
  }
  while (p->shifts_todo != (Shift *)0x0) {
    pSVar3 = p->free_shifts->next;
    pSVar2 = p->shifts_todo->snode;
    uVar5 = pSVar2->refcount - 1;
    pSVar2->refcount = uVar5;
    if (uVar5 == 0) {
      free_SNode(p,p->shifts_todo->snode);
    }
    free(p->free_shifts);
    p->free_shifts = pSVar3;
  }
  while (p->free_reductions != (Reduction *)0x0) {
    pRVar1 = p->free_reductions->next;
    free(p->free_reductions);
    p->free_reductions = pRVar1;
  }
  while (p->free_shifts != (Shift *)0x0) {
    pSVar3 = p->free_shifts->next;
    free(p->free_shifts);
    p->free_shifts = pSVar3;
  }
  while (p->free_pnodes != (PNode *)0x0) {
    pPVar4 = p->free_pnodes->all_next;
    free(p->free_pnodes);
    p->free_pnodes = pPVar4;
  }
  while (p->free_znodes != (ZNode *)0x0) {
    pPVar4 = p->free_znodes->pn;
    free(p->free_znodes);
    p->free_znodes = (ZNode *)pPVar4;
  }
  while (p->free_snodes != (SNode *)0x0) {
    pSVar2 = p->free_snodes->all_next;
    free(p->free_snodes);
    p->free_snodes = pSVar2;
  }
  for (r._4_4_ = 0; r._4_4_ < (p->error_reductions).n; r._4_4_ = r._4_4_ + 1) {
    free((p->error_reductions).v[r._4_4_]);
  }
  if (((p->error_reductions).v != (D_Reduction **)0x0) &&
     ((p->error_reductions).v != (p->error_reductions).e)) {
    free((p->error_reductions).v);
  }
  (p->error_reductions).n = 0;
  (p->error_reductions).v = (D_Reduction **)0x0;
  if (p->whitespace_parser != (Parser *)0x0) {
    free_parser_working_data(p->whitespace_parser);
  }
  free(p->shift_results);
  p->shift_results = (ShiftResult *)0x0;
  p->nshift_results = 0;
  free(p->code_shifts);
  p->code_shifts = (D_Shift *)0x0;
  p->ncode_shifts = 0;
  return;
}

Assistant:

static void free_parser_working_data(Parser *p) {
  uint i;

  free_old_nodes(p);
  free_old_nodes(p); /* to catch SNodes saved for error repair */
  if (p->pnode_hash.v) FREE(p->pnode_hash.v);
  if (p->snode_hash.v) FREE(p->snode_hash.v);
  memset(&p->pnode_hash, 0, sizeof(p->pnode_hash));
  memset(&p->snode_hash, 0, sizeof(p->snode_hash));
  while (p->reductions_todo) {
    Reduction *r = p->free_reductions->next;
    unref_sn(p, p->reductions_todo->snode);
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->shifts_todo) {
    Shift *s = p->free_shifts->next;
    unref_sn(p, p->shifts_todo->snode);
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_reductions) {
    Reduction *r = p->free_reductions->next;
    FREE(p->free_reductions);
    p->free_reductions = r;
  }
  while (p->free_shifts) {
    Shift *s = p->free_shifts->next;
    FREE(p->free_shifts);
    p->free_shifts = s;
  }
  while (p->free_pnodes) {
    PNode *pn = p->free_pnodes->all_next;
    FREE(p->free_pnodes);
    p->free_pnodes = pn;
  }
  while (p->free_znodes) {
    ZNode *zn = znode_next(p->free_znodes);
    FREE(p->free_znodes);
    p->free_znodes = zn;
  }
  while (p->free_snodes) {
    SNode *sn = p->free_snodes->all_next;
    FREE(p->free_snodes);
    p->free_snodes = sn;
  }
  for (i = 0; i < p->error_reductions.n; i++) FREE(p->error_reductions.v[i]);
  vec_free(&p->error_reductions);
  if (p->whitespace_parser) free_parser_working_data(p->whitespace_parser);
  FREE(p->shift_results);
  p->shift_results = NULL;
  p->nshift_results = 0;
  FREE(p->code_shifts);
  p->code_shifts = NULL;
  p->ncode_shifts = 0;
}